

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

void Wlc_NtkExploreMem(Wlc_Ntk_t *p,int nFrames)

{
  int iVar1;
  int iVar2;
  uint iObj;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Wlc_Obj_t *pWVar3;
  char *pcVar4;
  int iVar5;
  uint i;
  uint uVar6;
  long lVar7;
  
  p_00 = Vec_IntStart(1000);
  p_01 = Wlc_NtkCollectMemory(p,1);
  Wlc_NtkCleanMarks(p);
  iVar1 = p_01->nSize;
  iVar5 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    iVar2 = Vec_IntEntry(p_01,iVar5);
    pWVar3 = Wlc_NtkObj(p,iVar2);
    *(byte *)pWVar3 = *(byte *)pWVar3 | 0x80;
  }
  for (iVar5 = 0; iVar5 != iVar1; iVar5 = iVar5 + 1) {
    iVar2 = Vec_IntEntry(p_01,iVar5);
    pWVar3 = Wlc_NtkObj(p,iVar2);
    if ((undefined1  [24])((undefined1  [24])*pWVar3 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x36) {
      p_00->nSize = 0;
      Wlc_NtkExploreMem_rec(p,pWVar3,p_00,nFrames);
      lVar7 = (long)pWVar3 - (long)p->pObjs;
      i = 0;
      printf("Read port %6d : ",lVar7 / 0x18 & 0xffffffff,lVar7 % 0x18);
      uVar6 = p_00->nSize;
      printf("Inputs = %6d  ",(ulong)uVar6);
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      for (; uVar6 != i; i = i + 1) {
        iObj = Vec_IntEntry(p_00,i);
        pcVar4 = Wlc_ObjName(p,iObj);
        printf("%d(%s) ",(ulong)iObj,pcVar4);
      }
      putchar(10);
    }
  }
  Vec_IntFree(p_01);
  Vec_IntFree(p_00);
  Wlc_NtkCleanMarks(p);
  return;
}

Assistant:

void Wlc_NtkExploreMem( Wlc_Ntk_t * p, int nFrames )
{
    Wlc_Obj_t * pObj; int i, k, iObj;
    Vec_Int_t * vCollect = Vec_IntStart( 1000 );
    Vec_Int_t * vMemObjsClean = Wlc_NtkCollectMemory( p, 1 );
    Wlc_NtkCleanMarks( p );
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
        pObj->Mark = 1;
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) != WLC_OBJ_READ )
            continue;
        Vec_IntClear( vCollect );
        Wlc_NtkExploreMem_rec( p, pObj, vCollect, nFrames );
        printf( "Read port %6d : ", Wlc_ObjId(p, pObj) );
        printf( "Inputs = %6d  ", Vec_IntSize(vCollect) );
        Vec_IntForEachEntry( vCollect, iObj, k )
            printf( "%d(%s) ", iObj, Wlc_ObjName(p, iObj) );
        printf( "\n" );
    }
    Vec_IntFree( vMemObjsClean );
    Vec_IntFree( vCollect );
    Wlc_NtkCleanMarks( p );
}